

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteGroup
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  undefined4 extraout_var;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = field_number << 3;
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  output->cur_ = pbVar6;
  bVar2 = (byte)uVar9;
  *pbVar6 = bVar2 | 3;
  if (uVar9 < 0x80) {
    pbVar5 = pbVar6 + 1;
  }
  else {
    *pbVar6 = bVar2 | 0x83;
    pbVar6[1] = (byte)(uVar9 >> 7);
    pbVar5 = pbVar6 + 2;
    if (0x3fff < uVar9) {
      uVar8 = (ulong)pbVar6[1];
      uVar7 = (ulong)(uVar9 >> 7);
      do {
        pbVar5[-1] = (byte)uVar8 | 0x80;
        uVar8 = uVar7 >> 7;
        *pbVar5 = (byte)uVar8;
        pbVar5 = pbVar5 + 1;
        uVar4 = (uint)uVar7;
        uVar7 = uVar8;
      } while (0x3fff < uVar4);
    }
  }
  output->cur_ = pbVar5;
  iVar3 = (*value->_vptr_MessageLite[0xb])(value,pbVar5,output);
  pbVar6 = (byte *)CONCAT44(extraout_var,iVar3);
  output->cur_ = pbVar6;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  output->cur_ = pbVar6;
  *pbVar6 = bVar2 | 4;
  if (uVar9 < 0x80) {
    pbVar5 = pbVar6 + 1;
  }
  else {
    *pbVar6 = bVar2 | 0x84;
    pbVar6[1] = (byte)(uVar9 >> 7);
    pbVar5 = pbVar6 + 2;
    if (0x3fff < uVar9) {
      uVar4 = (uint)pbVar6[1];
      uVar9 = uVar9 >> 7;
      do {
        pbVar5[-1] = (byte)uVar4 | 0x80;
        uVar4 = uVar9 >> 7;
        *pbVar5 = (byte)uVar4;
        pbVar5 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar9;
        uVar9 = uVar4;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar5;
  return;
}

Assistant:

void WireFormatLite::WriteGroup(int field_number, const MessageLite& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  value.SerializeWithCachedSizes(output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}